

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_linalg.c
# Opt level: O2

void cupdlp_compute_interaction_and_movement
               (CUPDLPwork *w,cupdlp_float *dMovement,cupdlp_float *dInteraction)

{
  cupdlp_int len;
  cupdlp_int len_00;
  CUPDLPiterates *pCVar1;
  CUPDLPvec *pCVar2;
  CUPDLPvec *pCVar3;
  CUPDLPvec *pCVar4;
  CUPDLPvec *pCVar5;
  CUPDLPvec *pCVar6;
  CUPDLPvec *pCVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  cupdlp_float dY;
  cupdlp_float dX;
  
  pCVar1 = w->iterates;
  len = w->problem->nRows;
  len_00 = w->problem->nCols;
  dVar10 = w->stepsize->dBeta;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  dX = 0.0;
  dY = 0.0;
  iVar9 = w->timers->nIter;
  iVar8 = iVar9 % 2;
  pCVar2 = pCVar1->x[iVar8];
  pCVar3 = pCVar1->y[iVar8];
  pCVar4 = pCVar1->aty[iVar8];
  iVar9 = (iVar9 + 1) % 2;
  pCVar5 = pCVar1->x[iVar9];
  pCVar6 = pCVar1->y[iVar9];
  pCVar7 = pCVar1->aty[iVar9];
  cupdlp_diffTwoNormSquared(w,pCVar2->data,pCVar5->data,len_00,&dX);
  cupdlp_diffTwoNormSquared(w,pCVar3->data,pCVar6->data,len,&dY);
  cupdlp_diffDotDiff(w,pCVar2->data,pCVar5->data,pCVar4->data,pCVar7->data,len_00,dInteraction);
  *dMovement = dY / (dVar10 + dVar10) + dX * 0.5 * dVar10;
  return;
}

Assistant:

void cupdlp_compute_interaction_and_movement(CUPDLPwork *w,
                                             cupdlp_float *dMovement,
                                             cupdlp_float *dInteraction) {
  CUPDLPiterates *iterates = w->iterates;
  cupdlp_int nCols = w->problem->nCols;
  cupdlp_int nRows = w->problem->nRows;
  cupdlp_float beta = sqrt(w->stepsize->dBeta);
  cupdlp_float dX = 0.0;
  cupdlp_float dY = 0.0;

  cupdlp_int iter = w->timers->nIter;
  CUPDLPvec *x = iterates->x[iter % 2];
  CUPDLPvec *y = iterates->y[iter % 2];
  CUPDLPvec *aty = iterates->aty[iter % 2];
  CUPDLPvec *xUpdate = iterates->x[(iter + 1) % 2];
  CUPDLPvec *yUpdate = iterates->y[(iter + 1) % 2];
  CUPDLPvec *atyUpdate = iterates->aty[(iter + 1) % 2];

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_movement_interaction_cuda(&dX, &dY, dInteraction, w->buffer2,
      xUpdate->data, x->data, yUpdate->data, y->data, atyUpdate->data, aty->data, nRows, nCols);
#else
    cupdlp_diffTwoNormSquared(w, x->data, xUpdate->data, nCols, &dX);
    cupdlp_diffTwoNormSquared(w, y->data, yUpdate->data, nRows, &dY);
    //      Δx' (AΔy)
    cupdlp_diffDotDiff(w, x->data, xUpdate->data, aty->data, atyUpdate->data,
                       nCols, dInteraction);
#endif
  *dMovement = dX * 0.5 * beta + dY / (2.0 * beta);
}